

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool ON_IsUTF8Encoded(bool bSloppy,char *buffer,int buffer_length)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000039;
  int iVar5;
  ON__UINT32 unicode_code_point;
  ON__UINT32 local_44;
  ON_UnicodeErrorParameters local_40;
  
  uVar1 = ON_UnicodeErrorParameters::MaskErrors._0_8_;
  iVar3 = 0;
  while( true ) {
    iVar5 = iVar3;
    iVar4 = (int)buffer;
    if (iVar4 - iVar5 == 0 || iVar4 < iVar5) break;
    local_40._0_8_ = uVar1;
    local_40.m_error_code_point = 0x110000;
    local_44 = 0x110000;
    iVar2 = ON_DecodeUTF8((char *)((long)iVar5 + CONCAT71(in_register_00000039,bSloppy)),
                          iVar4 - iVar5,&local_40,&local_44);
    if (((iVar2 < 1) || (iVar3 = ON_IsValidUnicodeCodePoint(local_44), iVar3 == 0)) ||
       (iVar3 = iVar2 + iVar5, iVar4 < iVar2 + iVar5)) break;
  }
  return iVar4 <= iVar5;
}

Assistant:

static bool ON_IsUTF8Encoded(bool bSloppy, const char* buffer, int buffer_length)
{
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return false;

  struct ON_UnicodeErrorParameters e0
    = bSloppy
    ? ON_UnicodeErrorParameters::FailOnErrors
    : ON_UnicodeErrorParameters::MaskErrors;
  e0.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
  ON__UINT32 unicode_code_point;
  int delta_i = 0;
  for (int i = 0; i < buffer_length; i += (delta_i > 0) ? delta_i : 1)
  {
    struct ON_UnicodeErrorParameters e = e0;
    unicode_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
    delta_i = ON_DecodeUTF8(buffer + i, buffer_length - i, &e, &unicode_code_point);
    if (delta_i > 0 && ON_IsValidUnicodeCodePoint(unicode_code_point) && i + delta_i <= buffer_length)
      continue;
    return false;
  }

  return true;
}